

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AtomicMachine::RunStage(AtomicMachine *this,int stage)

{
  CallLogWrapper *pCVar1;
  ShaderImageLoadStoreBase *this_00;
  _Alloc_hider _Var2;
  bool bVar3;
  GLint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  undefined7 extraout_var;
  long lVar7;
  char *pcVar8;
  GLenum GVar9;
  int in_EDX;
  int stage_00;
  int stage_01;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  float *pfVar10;
  GLsizei GVar11;
  int i_3;
  GLenum *pGVar12;
  int i;
  ulong uVar13;
  GLuint buffer;
  GLuint texture_result;
  string source;
  GLuint textures [7];
  char *src;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  vec4 color;
  float local_48 [2];
  float afStack_40 [4];
  
  this_00 = (ShaderImageLoadStoreBase *)(ulong)(uint)stage;
  bVar3 = ShaderImageLoadStoreBase::SupportedInStage
                    (&this->super_ShaderImageLoadStoreBase,stage,in_EDX);
  lVar7 = 0x10;
  if (bVar3) {
    GVar9 = (&switchD_009ccdfd::switchdataD_01aaa89c)[(long)this_00] + 0x1aaa89c;
    switch(this_00) {
    case (ShaderImageLoadStoreBase *)0x0:
      GenShader<int>(&source,(AtomicMachine *)0x0,stage_00,GVar9);
      GVar6 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,source._M_dataplus._M_p,(char *)0x0,
                         (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x1:
      GenShader<int>(&source,(AtomicMachine *)&DAT_00000001,stage_00,GVar9);
      GVar6 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,"#version 420 core\nvoid main() {}",
                         source._M_dataplus._M_p,
                         "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                         (char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x2:
      GenShader<int>(&source,(AtomicMachine *)0x2,stage_00,GVar9);
      GVar6 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,"#version 420 core\nvoid main() {}",
                         (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x3:
      GenShader<int>(&source,(AtomicMachine *)0x3,stage_00,GVar9);
      GVar6 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,"#version 420 core\nvoid main() {}",
                         (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
      break;
    default:
      GenShader<int>(&source,(AtomicMachine *)&DAT_00000004,stage_00,
                     (GLenum)CONCAT71(extraout_var,bVar3));
      src = source._M_dataplus._M_p;
      pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper;
      GVar5 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
      glu::CallLogWrapper::glShaderSource(pCVar1,GVar5,1,&src,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(pCVar1,GVar5);
      GVar6 = glu::CallLogWrapper::glCreateProgram(pCVar1);
      glu::CallLogWrapper::glAttachShader(pCVar1,GVar6,GVar5);
      glu::CallLogWrapper::glLinkProgram(pCVar1,GVar6);
      glu::CallLogWrapper::glDeleteShader(pCVar1,GVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
    glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
    glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
    pGVar12 = &DAT_01aaae30;
    uVar13 = 0;
    do {
      GVar9 = *pGVar12;
      glu::CallLogWrapper::glBindTexture(pCVar1,GVar9,textures[uVar13]);
      if (uVar13 == 4) {
        glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
        glu::CallLogWrapper::glBufferData(pCVar1,0x8c2a,4,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
        glu::CallLogWrapper::glTexBuffer(pCVar1,GVar9,0x8235,buffer);
        goto switchD_009cd059_caseD_4;
      }
      glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2800,0x2600);
      switch(uVar13 & 0xffffffff) {
      case 0:
      case 2:
        goto LAB_009cd0b8;
      case 1:
      case 6:
        glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar9,1,0x8235,1,1,2);
        break;
      case 3:
        GVar9 = 0x8513;
LAB_009cd0b8:
        GVar11 = 1;
LAB_009cd0ce:
        glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar9,1,0x8235,1,GVar11);
        break;
      case 5:
        GVar9 = 0x8c18;
        GVar11 = 2;
        goto LAB_009cd0ce;
      }
switchD_009cd059_caseD_4:
      uVar13 = uVar13 + 1;
      pGVar12 = pGVar12 + 1;
    } while (uVar13 != 7);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[1],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[2],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[3],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[4],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[5],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[6],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glUseProgram(pCVar1,GVar6);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_result");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,0);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,1);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_3d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,2);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2drect");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,3);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_cube");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,4);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_buffer");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,5);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_1darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,6);
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,7);
    glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
    if (stage - 1U < 2) {
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
    }
    else if (stage == 4) {
      glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
    }
    else {
      glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
    }
    color.m_data[0] = 0.0;
    color.m_data[1] = 0.0;
    color.m_data[2] = 0.0;
    color.m_data[3] = 0.0;
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
    lVar7 = 0;
    GVar9 = 0x1908;
    glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
    source._M_dataplus._M_p = (pointer)0x3f80000000000000;
    source._M_string_length = 0x3f80000000000000;
    bVar3 = true;
    do {
      if (bVar3) {
        bVar3 = (float)textures[lVar7 + -8] == color.m_data[lVar7];
      }
      else {
        bVar3 = false;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    if (bVar3) {
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar6);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      if ((uint)stage < 4) {
        lVar7 = (*(code *)(&DAT_01aaa8c8 + *(int *)(&DAT_01aaa8c8 + (long)this_00 * 4)))();
        return lVar7;
      }
      GenShader<unsigned_int>(&source,(AtomicMachine *)&DAT_00000004,stage_01,GVar9);
      src = source._M_dataplus._M_p;
      GVar5 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
      glu::CallLogWrapper::glShaderSource(pCVar1,GVar5,1,&src,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(pCVar1,GVar5);
      GVar6 = glu::CallLogWrapper::glCreateProgram(pCVar1);
      glu::CallLogWrapper::glAttachShader(pCVar1,GVar6,GVar5);
      glu::CallLogWrapper::glLinkProgram(pCVar1,GVar6);
      glu::CallLogWrapper::glDeleteShader(pCVar1,GVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
      glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
      pGVar12 = &DAT_01aaae30;
      uVar13 = 0;
      do {
        GVar9 = *pGVar12;
        glu::CallLogWrapper::glBindTexture(pCVar1,GVar9,textures[uVar13]);
        if (uVar13 == 4) {
          glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
          glu::CallLogWrapper::glBufferData(pCVar1,0x8c2a,4,(void *)0x0,0x88e8);
          glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
          glu::CallLogWrapper::glTexBuffer(pCVar1,GVar9,0x8236,buffer);
          goto switchD_009cd863_caseD_4;
        }
        glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(pCVar1,GVar9,0x2800,0x2600);
        switch(uVar13 & 0xffffffff) {
        case 0:
        case 2:
          goto LAB_009cd8c2;
        case 1:
        case 6:
          glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar9,1,0x8236,1,1,2);
          break;
        case 3:
          GVar9 = 0x8513;
LAB_009cd8c2:
          GVar11 = 1;
LAB_009cd8d8:
          glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar9,1,0x8236,1,GVar11);
          break;
        case 5:
          GVar9 = 0x8c18;
          GVar11 = 2;
          goto LAB_009cd8d8;
        }
switchD_009cd863_caseD_4:
        uVar13 = uVar13 + 1;
        pGVar12 = pGVar12 + 1;
      } while (uVar13 != 7);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[1],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[2],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[3],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[4],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[5],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[6],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glUseProgram(pCVar1,GVar6);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_result");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,0);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,1);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,2);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,3);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,4);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_buffer");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,5);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,6);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar4,7);
      glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
      if (stage - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
      }
      else if (stage == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
      }
      color.m_data[0] = 0.0;
      color.m_data[1] = 0.0;
      color.m_data[2] = 0.0;
      color.m_data[3] = 0.0;
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
      lVar7 = 0;
      glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
      source._M_dataplus._M_p = (pointer)0x3f80000000000000;
      source._M_string_length = 0x3f80000000000000;
      bVar3 = true;
      do {
        if (bVar3) {
          bVar3 = (float)textures[lVar7 + -8] == color.m_data[lVar7];
        }
        else {
          bVar3 = false;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      if (bVar3 == false) {
        pfVar10 = local_48;
        local_48[0] = color.m_data[0];
        local_48[1] = color.m_data[1];
        afStack_40[0] = color.m_data[2];
        afStack_40[1] = color.m_data[3];
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                  (&source,pfVar10,v_00);
        _Var2 = source._M_dataplus;
        local_78 = 0x75323372;
        uStack_74 = 0x69;
        uStack_73 = 0;
        local_80 = 5;
        src = (char *)&local_78;
        pcVar8 = ShaderImageLoadStoreBase::StageName(this_00,(int)pfVar10);
        anon_unknown_0::Output
                  ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var2._M_p,&local_78,pcVar8);
        if (src != (char *)&local_78) {
          operator_delete(src,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))) +
                              1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)source._M_dataplus._M_p != &source.field_2) {
          operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
        }
      }
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar6);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      lVar7 = (ulong)bVar3 - 1;
    }
    else {
      pfVar10 = local_48;
      local_48[0] = color.m_data[0];
      local_48[1] = color.m_data[1];
      afStack_40[0] = color.m_data[2];
      afStack_40[1] = color.m_data[3];
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&source,pfVar10,v);
      _Var2 = source._M_dataplus;
      local_78 = 0x69323372;
      local_80 = 4;
      uStack_74 = 0;
      src = (char *)&local_78;
      ShaderImageLoadStoreBase::StageName(this_00,(int)pfVar10);
      anon_unknown_0::Output("Color is: %s. Format is: %s. Stage is: %s.\n",_Var2._M_p,&local_78);
      if (src != (char *)&local_78) {
        operator_delete(src,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar6);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      lVar7 = -1;
    }
  }
  return lVar7;
}

Assistant:

long RunStage(int stage)
	{
		if (!SupportedInStage(stage, 8))
			return NOT_SUPPORTED;
		if (!Atomic<GLint>(stage, GL_R32I))
			return ERROR;
		if (!Atomic<GLuint>(stage, GL_R32UI))
			return ERROR;
		return NO_ERROR;
	}